

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Noise.cpp
# Opt level: O1

Vector * noise_3d(Vector *__return_storage_ptr__,Vector *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  double *pdVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  pdVar5 = noise_table;
  piVar4 = hash_table;
  dVar25 = p->x + 10000.0;
  dVar22 = p->y + 10000.0;
  dVar18 = p->z + 10000.0;
  Noise3dCalls = Noise3dCalls + 1;
  lVar6 = (long)dVar25;
  lVar9 = (long)dVar22;
  lVar11 = (long)dVar18;
  dVar13 = dVar25 - (double)lVar6;
  dVar27 = (3.0 - (dVar13 + dVar13)) * dVar13 * dVar13;
  dVar23 = dVar22 - (double)lVar9;
  dVar16 = (3.0 - (dVar23 + dVar23)) * dVar23 * dVar23;
  dVar24 = dVar18 - (double)lVar11;
  dVar14 = (3.0 - (dVar24 + dVar24)) * dVar24 * dVar24;
  dVar26 = 1.0 - dVar14;
  uVar1 = hash_table[(uint)lVar6 & 0xfff];
  uVar8 = (uint)lVar9 & 0xfff;
  uVar2 = hash_table[(int)(uVar1 ^ uVar8)];
  uVar10 = (uint)lVar11 & 0xfff;
  uVar7 = (ulong)*(byte *)(hash_table + (int)(uVar2 ^ uVar10));
  dVar17 = (1.0 - dVar27) * (1.0 - dVar16);
  dVar21 = dVar17 * dVar26;
  dVar28 = (noise_table[uVar7 + 3] * dVar24 +
           noise_table[uVar7 + 2] * dVar23 +
           noise_table[uVar7] * 0.5 + noise_table[uVar7 + 1] * dVar13) * dVar21;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar24 +
           pdVar5[uVar7 + 6] * dVar23 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar13) *
           dVar21;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (pdVar5[uVar7 + 0xb] * dVar24 +
           pdVar5[uVar7 + 10] * dVar23 + pdVar5[uVar7 + 8] * 0.5 + pdVar5[uVar7 + 9] * dVar13) *
           dVar21;
  dVar25 = dVar25 - (double)(lVar6 + 1);
  __return_storage_ptr__->z = dVar21;
  uVar3 = piVar4[(uint)(lVar6 + 1) & 0xfff];
  uVar8 = piVar4[(int)(uVar8 ^ uVar3)];
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar8 ^ uVar10));
  dVar19 = (1.0 - dVar16) * dVar27;
  dVar20 = dVar19 * dVar26;
  dVar28 = (pdVar5[uVar7 + 3] * dVar24 +
           pdVar5[uVar7 + 2] * dVar23 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar25) * dVar20 +
           dVar28;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar24 +
           pdVar5[uVar7 + 6] * dVar23 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar25) *
           dVar20 + dVar15;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (pdVar5[uVar7 + 0xb] * dVar24 +
           pdVar5[uVar7 + 10] * dVar23 + pdVar5[uVar7 + 8] * 0.5 + pdVar5[uVar7 + 9] * dVar25) *
           dVar20 + dVar21;
  dVar22 = dVar22 - (double)(lVar9 + 1);
  __return_storage_ptr__->z = dVar21;
  uVar12 = (uint)(lVar9 + 1) & 0xfff;
  uVar3 = piVar4[(int)(uVar3 ^ uVar12)];
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar3 ^ uVar10));
  dVar20 = dVar27 * dVar16 * dVar26;
  dVar28 = (pdVar5[uVar7 + 3] * dVar24 +
           pdVar5[uVar7 + 2] * dVar22 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar25) * dVar20 +
           dVar28;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar24 +
           pdVar5[uVar7 + 6] * dVar22 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar25) *
           dVar20 + dVar15;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (pdVar5[uVar7 + 0xb] * dVar24 +
           pdVar5[uVar7 + 10] * dVar22 + pdVar5[uVar7 + 8] * 0.5 + pdVar5[uVar7 + 9] * dVar25) *
           dVar20 + dVar21;
  dVar20 = (1.0 - dVar27) * dVar16;
  __return_storage_ptr__->z = dVar21;
  uVar1 = piVar4[(int)(uVar12 ^ uVar1)];
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar10 ^ uVar1));
  dVar26 = dVar26 * dVar20;
  dVar28 = (pdVar5[uVar7 + 3] * dVar24 +
           pdVar5[uVar7 + 2] * dVar22 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar13) * dVar26 +
           dVar28;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar24 +
           pdVar5[uVar7 + 6] * dVar22 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar13) *
           dVar26 + dVar15;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (dVar24 * pdVar5[uVar7 + 0xb] +
           pdVar5[uVar7 + 10] * dVar22 + pdVar5[uVar7 + 8] * 0.5 + pdVar5[uVar7 + 9] * dVar13) *
           dVar26 + dVar21;
  __return_storage_ptr__->z = dVar21;
  uVar10 = (uint)(lVar11 + 1) & 0xfff;
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar1 ^ uVar10));
  dVar18 = dVar18 - (double)(lVar11 + 1);
  dVar20 = dVar20 * dVar14;
  dVar28 = (pdVar5[uVar7 + 3] * dVar18 +
           pdVar5[uVar7 + 2] * dVar22 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar13) * dVar20 +
           dVar28;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar18 +
           pdVar5[uVar7 + 6] * dVar22 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar13) *
           dVar20 + dVar15;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (pdVar5[uVar7 + 0xb] * dVar18 +
           pdVar5[uVar7 + 10] * dVar22 + pdVar5[uVar7 + 8] * 0.5 + pdVar5[uVar7 + 9] * dVar13) *
           dVar20 + dVar21;
  __return_storage_ptr__->z = dVar21;
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar3 ^ uVar10));
  dVar16 = dVar27 * dVar16 * dVar14;
  dVar28 = (pdVar5[uVar7 + 3] * dVar18 +
           pdVar5[uVar7 + 2] * dVar22 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar25) * dVar16 +
           dVar28;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar18 +
           pdVar5[uVar7 + 6] * dVar22 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar25) *
           dVar16 + dVar15;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (pdVar5[uVar7 + 0xb] * dVar18 +
           dVar22 * pdVar5[uVar7 + 10] + pdVar5[uVar7 + 8] * 0.5 + pdVar5[uVar7 + 9] * dVar25) *
           dVar16 + dVar21;
  __return_storage_ptr__->z = dVar21;
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar8 ^ uVar10));
  dVar19 = dVar19 * dVar14;
  dVar28 = (pdVar5[uVar7 + 3] * dVar18 +
           pdVar5[uVar7 + 2] * dVar23 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar25) * dVar19 +
           dVar28;
  __return_storage_ptr__->x = dVar28;
  dVar15 = (pdVar5[uVar7 + 7] * dVar18 +
           pdVar5[uVar7 + 6] * dVar23 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar25) *
           dVar19 + dVar15;
  __return_storage_ptr__->y = dVar15;
  dVar21 = (pdVar5[uVar7 + 0xb] * dVar18 +
           pdVar5[uVar7 + 10] * dVar23 + pdVar5[uVar7 + 8] * 0.5 + dVar25 * pdVar5[uVar7 + 9]) *
           dVar19 + dVar21;
  __return_storage_ptr__->z = dVar21;
  uVar7 = (ulong)*(byte *)(piVar4 + (int)(uVar10 ^ uVar2));
  dVar17 = dVar17 * dVar14;
  __return_storage_ptr__->x =
       (pdVar5[uVar7 + 3] * dVar18 +
       pdVar5[uVar7 + 2] * dVar23 + pdVar5[uVar7] * 0.5 + pdVar5[uVar7 + 1] * dVar13) * dVar17 +
       dVar28;
  __return_storage_ptr__->y =
       (pdVar5[uVar7 + 7] * dVar18 +
       pdVar5[uVar7 + 6] * dVar23 + pdVar5[uVar7 + 4] * 0.5 + pdVar5[uVar7 + 5] * dVar13) * dVar17 +
       dVar15;
  __return_storage_ptr__->z =
       (dVar18 * pdVar5[uVar7 + 0xb] +
       dVar23 * pdVar5[uVar7 + 10] + pdVar5[uVar7 + 8] * 0.5 + dVar13 * pdVar5[uVar7 + 9]) * dVar17
       + dVar21;
  return __return_storage_ptr__;
}

Assistant:

Vector noise_3d( const Vector& p )
{
   double sx,sy,sz,tx,ty,tz;
   long ix,iy,iz,jx,jy,jz;
   double s, px, py, pz;
   int   m;
   Vector result (0);
   Vector v = p;

   Noise3dCalls++;

   setup_lattice(v,ix,iy,iz,jx,jy,jz,sx,sy,sz,tx,ty,tz);

   double x = v.x;
   double y = v.y;
   double z = v.z;
   //
   // Interpolate
   //
   m =   HASH( ix, iy, iz ) & 0xFF;
   px = x-ix;  py = y-iy;  pz = z-iz;
   s =   tx*ty*tz;
   result.x = INCRSUM(m,s,px,py,pz);
   result.y = INCRSUM(m+4,s,px,py,pz);
   result.z = INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, iz ) & 0xFF;
   px = x-jx;
   s =   sx*ty*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, iz ) & 0xFF;
   py = y-jy;
   s =   sx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, iz ) & 0xFF;
   px = x-ix;
   s =   tx*sy*tz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, jy, jz ) & 0xFF;
   pz = z-jz;
   s =   tx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, jy, jz ) & 0xFF;
   px = x-jx;
   s =   sx*sy*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( jx, iy, jz ) & 0xFF;
   py = y-iy;
   s =   sx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

   m =   HASH( ix, iy, jz ) & 0xFF;
   px = x-ix;
   s =   tx*ty*sz;
   result.x += INCRSUM(m,s,px,py,pz);
   result.y += INCRSUM(m+4,s,px,py,pz);
   result.z += INCRSUM(m+8,s,px,py,pz);

// DEBUG
// printf("Noise3D: result == <%g %g %g>\n",result.x,result.y,result.z);
   return result;
}